

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDecoder.cpp
# Opt level: O2

int ZXing::Pdf417::TextCompaction
              (vector<int,_std::allocator<int>_> *codewords,int codeIndex,Content *result)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int codeIndex_00;
  long lVar4;
  long *plVar5;
  uint8_t val;
  int iVar6;
  int *piVar7;
  bool bVar8;
  int iVar9;
  int index;
  allocator_type local_69;
  vector<int,_std::allocator<int>_> textCompactionData;
  uint local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  index = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&textCompactionData,
             ((long)*(codewords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start - (long)codeIndex) * 2,&index,&local_69);
  index = 0;
  bVar8 = false;
  while ((iVar2 = index,
         piVar7 = (codewords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start, codeIndex < *piVar7 && (!bVar8))) {
    iVar2 = codeIndex + 1;
    iVar9 = piVar7[codeIndex];
    if (iVar9 < 900) {
      textCompactionData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[index] = iVar9 / 0x1e;
      textCompactionData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[(long)index + 1] = iVar9 % 0x1e;
      index = index + 2;
      codeIndex = iVar2;
      goto LAB_0017ee89;
    }
    uVar1 = iVar9 - 900;
    if (0x1c < uVar1) goto LAB_0017f16e;
    bVar8 = true;
    if ((0x11c00007U >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0xe000000U >> (uVar1 & 0x1f) & 1) == 0) {
        if (uVar1 != 0xd) {
LAB_0017f16e:
          plVar5 = (long *)__cxa_allocate_exception(0x30);
          local_40 = local_40 & 0xffffff00;
          *plVar5 = (long)(plVar5 + 2);
          *(uint *)(plVar5 + 2) = local_40;
          *(undefined4 *)((long)plVar5 + 0x14) = uStack_3c;
          *(undefined4 *)(plVar5 + 3) = uStack_38;
          *(undefined4 *)((long)plVar5 + 0x1c) = uStack_34;
          plVar5[1] = 0;
          plVar5[4] = (long)"src/pdf417/PDFDecoder.cpp";
          *(undefined2 *)(plVar5 + 5) = 0x125;
          *(undefined1 *)((long)plVar5 + 0x2a) = 1;
          __cxa_throw(plVar5,&Error::typeinfo,Error::~Error);
        }
        lVar4 = (long)index;
        index = index + 1;
        textCompactionData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar4] = 0x391;
        codeIndex = iVar2;
        while (codeIndex < *piVar7) {
          iVar2 = piVar7[codeIndex];
          codeIndex = codeIndex + 1;
          if (2 < iVar2 - 0x39dU) {
            lVar4 = (long)index;
            index = index + 1;
            textCompactionData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4] = iVar2;
            break;
          }
          codeIndex = ProcessTextECI(&textCompactionData,&index,codewords,codeIndex,iVar2);
          piVar7 = (codewords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        }
LAB_0017ee89:
        bVar8 = false;
      }
      else {
        codeIndex = ProcessTextECI(&textCompactionData,&index,codewords,iVar2,iVar9);
        bVar8 = false;
      }
    }
  }
  codeIndex_00 = 0;
  iVar9 = 0;
LAB_0017ef4c:
  do {
    while( true ) {
      if (iVar2 <= codeIndex_00) {
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&textCompactionData.super__Vector_base<int,_std::allocator<int>_>);
        return codeIndex;
      }
      iVar3 = textCompactionData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[codeIndex_00];
      if (2 < iVar3 - 0x39dU) break;
      codeIndex_00 = ProcessECI(&textCompactionData,codeIndex_00 + 1,iVar2,iVar3,result);
    }
    if (iVar3 == 0x391) {
      for (codeIndex_00 = codeIndex_00 + 1; codeIndex_00 < iVar2;
          codeIndex_00 = ProcessECI(&textCompactionData,codeIndex_00,iVar2,iVar3,result)) {
        iVar3 = textCompactionData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[codeIndex_00];
        codeIndex_00 = codeIndex_00 + 1;
        if (2 < iVar3 - 0x39dU) {
          Content::push_back(result,(uint8_t)iVar3);
          break;
        }
      }
      goto LAB_0017ef4c;
    }
    iVar6 = iVar9;
    if (iVar3 < 0x1a) {
      val = (iVar9 != 0) * ' ' + (char)iVar3 + 'A';
      if (val != '\0') {
LAB_0017f0b9:
        Content::push_back(result,val);
      }
    }
    else {
      val = ' ';
      if (iVar3 == 0x1a) goto LAB_0017f0b9;
      if ((iVar3 == 0x1b) && (iVar9 == 0)) {
        iVar6 = 1;
      }
      else if ((iVar3 != 0x1b) || (iVar6 = 4, iVar9 != 1)) {
        if (iVar3 == 0x1c) {
          iVar6 = 2;
        }
        else {
          iVar6 = iVar9;
          if ((codeIndex_00 + 1 < iVar2) &&
             (textCompactionData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[codeIndex_00 + 1] != 0x391)) {
            iVar6 = 5;
          }
        }
      }
    }
    codeIndex_00 = codeIndex_00 + 1;
    iVar9 = iVar6;
  } while( true );
}

Assistant:

static int TextCompaction(const std::vector<int>& codewords, int codeIndex, Content& result)
{
	// 2 characters per codeword
	std::vector<int> textCompactionData((codewords[0] - codeIndex) * 2, 0);

	int index = 0;
	bool end = false;

	while ((codeIndex < codewords[0]) && !end) {
		int code = codewords[codeIndex++];
		if (code < TEXT_COMPACTION_MODE_LATCH) {
			textCompactionData[index] = code / 30;
			textCompactionData[index + 1] = code % 30;
			index += 2;
		} else {
			switch (code) {
			case MODE_SHIFT_TO_BYTE_COMPACTION_MODE:
				// The Mode Shift codeword 913 shall cause a temporary
				// switch from Text Compaction mode to Byte Compaction mode.
				// This switch shall be in effect for only the next codeword,
				// after which the mode shall revert to the prevailing sub-mode
				// of the Text Compaction mode. Codeword 913 is only available
				// in Text Compaction mode; its use is described in 5.4.2.4.
				textCompactionData[index++] = MODE_SHIFT_TO_BYTE_COMPACTION_MODE;
				// 5.5.3.1 allows ECIs anywhere in Text Compaction, including after a Shift to Byte
				while (codeIndex < codewords[0] && IsECI(codewords[codeIndex])) {
					codeIndex = ProcessTextECI(textCompactionData, index, codewords, codeIndex + 1, codewords[codeIndex]);
				}
				if (codeIndex < codewords[0])
					textCompactionData[index++] = codewords[codeIndex++]; // Byte to shift
				break;
			case ECI_CHARSET:
			case ECI_GENERAL_PURPOSE:
			case ECI_USER_DEFINED:
				codeIndex = ProcessTextECI(textCompactionData, index, codewords, codeIndex, code);
				break;
			default:
				if (!TerminatesCompaction(code))
					throw FormatError();

				codeIndex--;
				end = true;
				break;
			}
		}
	}
	DecodeTextCompaction(textCompactionData, index, result);
	return codeIndex;
}